

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeTree.cpp
# Opt level: O1

void __thiscall
Indexing::CodeTree::Compiler<true>::handleVar
          (Compiler<true> *this,uint var,Stack<unsigned_int> *globalCounterparts)

{
  uint uVar1;
  Stack<Indexing::CodeTree::CodeOp> *pSVar2;
  CodeOp *pCVar3;
  uint *puVar4;
  bool bVar5;
  uint *globalVarNumPtr;
  uint *varNumPtr;
  uint *local_38;
  uint *local_30;
  
  bVar5 = ::Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::getValuePtr
                    (&this->varMap,var,&local_30);
  if (bVar5) {
    uVar1 = this->nextVarNum;
    this->nextVarNum = uVar1 + 1;
    *local_30 = uVar1;
    pSVar2 = this->code;
    if (pSVar2->_cursor == pSVar2->_end) {
      ::Lib::Stack<Indexing::CodeTree::CodeOp>::expand(pSVar2);
    }
    pCVar3 = pSVar2->_cursor;
    pCVar3->_content = (ulong)uVar1 * 8 + 4;
    pCVar3->_alternative = (CodeOp *)0x0;
    pSVar2->_cursor = pSVar2->_cursor + 1;
    bVar5 = ::Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::
            getValuePtr(&this->globalVarMap,var,&local_38);
    if (bVar5) {
      uVar1 = this->nextGlobalVarNum;
      this->nextGlobalVarNum = uVar1 + 1;
      *local_38 = uVar1;
    }
    uVar1 = *local_38;
    if (globalCounterparts->_cursor == globalCounterparts->_end) {
      ::Lib::Stack<unsigned_int>::expand(globalCounterparts);
    }
    puVar4 = globalCounterparts->_cursor;
    *puVar4 = uVar1;
    globalCounterparts->_cursor = puVar4 + 1;
  }
  else {
    pSVar2 = this->code;
    uVar1 = *local_30;
    if (pSVar2->_cursor == pSVar2->_end) {
      ::Lib::Stack<Indexing::CodeTree::CodeOp>::expand(pSVar2);
    }
    pCVar3 = pSVar2->_cursor;
    pCVar3->_content = (ulong)uVar1 * 8 + 5;
    pCVar3->_alternative = (CodeOp *)0x0;
    pSVar2->_cursor = pSVar2->_cursor + 1;
  }
  return;
}

Assistant:

void CodeTree::Compiler<forLits>::handleVar(unsigned var, Stack<unsigned>* globalCounterparts)
{
  unsigned* varNumPtr;
  if (varMap.getValuePtr(var,varNumPtr)) {
    *varNumPtr = nextVarNum++;
    code.push(CodeOp::getTermOp(ASSIGN_VAR, *varNumPtr));

    if constexpr (forLits) {
      unsigned* globalVarNumPtr;
      if (globalVarMap.getValuePtr(var,globalVarNumPtr)) {
        *globalVarNumPtr = nextGlobalVarNum++;
      }
      globalCounterparts->push(*globalVarNumPtr);
    }
  } else {
    code.push(CodeOp::getTermOp(CHECK_VAR, *varNumPtr));
  }
}